

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogg-read.c
# Opt level: O0

int ogg_check_page_cksum(ogg_page_t *page)

{
  uchar *puVar1;
  unsigned_long uVar2;
  unsigned_long crc;
  uchar *ptr;
  ogg_page_t *page_local;
  
  if (page == (ogg_page_t *)0x0) {
    __assert_fail("page != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/ogg-read.c",0x51,
                  "int ogg_check_page_cksum(ogg_page_t *)");
  }
  if (0x1a < page->size) {
    puVar1 = (page->raw).data;
    memset(puVar1 + 0x16,0,4);
    uVar2 = crc32(&ogg_crc32,(page->raw).data,page->size);
    puVar1[0x16] = (uchar)page->page_cksum;
    puVar1[0x17] = (uchar)(page->page_cksum >> 8);
    puVar1[0x18] = (uchar)(page->page_cksum >> 0x10);
    puVar1[0x19] = (uchar)(page->page_cksum >> 0x18);
    page_local._4_4_ = (uint)(uVar2 == page->page_cksum);
    return page_local._4_4_;
  }
  __assert_fail("page->size >= OGG_HDR_MIN_SIZE",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/ogg-read.c",0x52,
                "int ogg_check_page_cksum(ogg_page_t *)");
}

Assistant:

int ogg_check_page_cksum(ogg_page_t *page) {
  assert(page != NULL);
  assert(page->size >= OGG_HDR_MIN_SIZE);
  
  /*M
    Fill the checksum in the raw frame with 0 bytes.
  **/
  unsigned char *ptr = page->raw.data + 22;
  memset(ptr, 0, 4);

  /*M
    Check the CRC32 sum of the whole page.
  **/
  unsigned long crc = crc32(&ogg_crc32, page->raw.data, page->size);

  LE_UINT32_PACK(ptr, page->page_cksum);
  if (crc == page->page_cksum)
    return 1;
  else
    return 0;
}